

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::api::anon_unknown_1::Image::create
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  VkImageCreateInfo imageInfo;
  VkImageCreateInfo local_60;
  
  local_60.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_60.pNext = (void *)0x0;
  local_60.flags = *(VkImageCreateFlags *)param_2;
  local_60.imageType = *(VkImageType *)(param_2 + 4);
  local_60.format = *(VkFormat *)(param_2 + 8);
  local_60.extent._0_8_ = *(undefined8 *)(param_2 + 0xc);
  local_60.extent.depth = *(deUint32 *)(param_2 + 0x14);
  local_60.mipLevels = *(deUint32 *)(param_2 + 0x18);
  local_60.arrayLayers = *(deUint32 *)(param_2 + 0x1c);
  local_60.samples = *(VkSampleCountFlagBits *)(param_2 + 0x20);
  local_60.tiling = *(VkImageTiling *)(param_2 + 0x24);
  local_60.usage = *(VkImageUsageFlags *)(param_2 + 0x28);
  local_60.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_60.queueFamilyIndexCount = 1;
  local_60.pQueueFamilyIndices = &env->queueFamilyIndex;
  local_60.initialLayout = *(VkImageLayout *)(param_2 + 0x2c);
  ::vk::createImage(__return_storage_ptr__,env->vkd,env->device,&local_60,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkImage> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkImageCreateInfo		imageInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,
			params.flags,
			params.imageType,
			params.format,
			params.extent,
			params.mipLevels,
			params.arraySize,
			params.samples,
			params.tiling,
			params.usage,
			VK_SHARING_MODE_EXCLUSIVE,		// sharingMode
			1u,								// queueFamilyIndexCount
			&env.queueFamilyIndex,			// pQueueFamilyIndices
			params.initialLayout
		};

		return createImage(env.vkd, env.device, &imageInfo, env.allocationCallbacks);
	}